

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetIntegerVerifier::verifyInteger4Mask
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,
          bool enableRef0,GLint reference1,bool enableRef1,GLint reference2,bool enableRef2,
          GLint reference3,bool enableRef3)

{
  ostringstream *this_00;
  bool bVar1;
  bool *pbVar2;
  bool *pbVar3;
  bool *pbVar4;
  StateQueryMemoryWriteGuard<int[4]> intVector4;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
            (&intVector4);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,intVector4.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                    (&intVector4,testCtx);
  if (bVar1) {
    if (((((enableRef0) && (intVector4.m_value[0] != reference0)) ||
         ((enableRef1 && (intVector4.m_value[1] != reference1)))) ||
        ((enableRef2 && (intVector4.m_value[2] != reference2)))) ||
       ((enableRef3 && (intVector4.m_value[3] != reference3)))) {
      local_1b0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"// ERROR: expected ");
      pbVar4 = (bool *)0x179c828;
      pbVar2 = (bool *)0x179c828;
      if (enableRef0) {
        pbVar2 = glcts::fixed_sample_locations_values + 1;
      }
      std::operator<<((ostream *)this_00,pbVar2);
      std::ostream::operator<<(this_00,reference0);
      pbVar2 = (bool *)0x17263e7;
      pbVar3 = (bool *)0x17263e7;
      if (enableRef0) {
        pbVar3 = glcts::fixed_sample_locations_values + 1;
      }
      std::operator<<((ostream *)this_00,pbVar3);
      std::operator<<((ostream *)this_00,", ");
      pbVar3 = (bool *)0x179c828;
      if (enableRef1) {
        pbVar3 = glcts::fixed_sample_locations_values + 1;
      }
      std::operator<<((ostream *)this_00,pbVar3);
      std::ostream::operator<<(this_00,reference1);
      pbVar3 = (bool *)0x17263e7;
      if (enableRef1) {
        pbVar3 = glcts::fixed_sample_locations_values + 1;
      }
      std::operator<<((ostream *)this_00,pbVar3);
      std::operator<<((ostream *)this_00,", ");
      pbVar3 = (bool *)0x179c828;
      if (enableRef2) {
        pbVar3 = glcts::fixed_sample_locations_values + 1;
      }
      std::operator<<((ostream *)this_00,pbVar3);
      std::ostream::operator<<(this_00,reference2);
      pbVar3 = (bool *)0x17263e7;
      if (enableRef2) {
        pbVar3 = glcts::fixed_sample_locations_values + 1;
      }
      std::operator<<((ostream *)this_00,pbVar3);
      std::operator<<((ostream *)this_00,", ");
      if (enableRef3) {
        pbVar4 = glcts::fixed_sample_locations_values + 1;
      }
      std::operator<<((ostream *)this_00,pbVar4);
      std::ostream::operator<<(this_00,reference3);
      if (enableRef3) {
        pbVar2 = glcts::fixed_sample_locations_values + 1;
      }
      std::operator<<((ostream *)this_00,pbVar2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyInteger4Mask (tcu::TestContext& testCtx, GLenum name, GLint reference0, bool enableRef0, GLint reference1, bool enableRef1, GLint reference2, bool enableRef2, GLint reference3, bool enableRef3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[4]> intVector4;
	glGetIntegerv(name, intVector4);

	if (!intVector4.verifyValidity(testCtx))
		return;

	if ((enableRef0 && (intVector4[0] != reference0)) ||
		(enableRef1 && (intVector4[1] != reference1)) ||
		(enableRef2 && (intVector4[2] != reference2)) ||
		(enableRef3 && (intVector4[3] != reference3)))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (enableRef0?"":"(") << reference0 << (enableRef0?"":")") << ", "
			<< (enableRef1?"":"(") << reference1 << (enableRef1?"":")") << ", "
			<< (enableRef2?"":"(") << reference2 << (enableRef2?"":")") << ", "
			<< (enableRef3?"":"(") << reference3 << (enableRef3?"":")")	<< TestLog::EndMessage;


		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}